

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O3

LPBYTE CaptureContentKey(LPBYTE pbDataPtr,LPBYTE pbDataEnd,PCONTENT_KEY *PtrCKey)

{
  if (pbDataEnd < pbDataPtr + 0x10) {
    return (LPBYTE)0x0;
  }
  *PtrCKey = (PCONTENT_KEY)pbDataPtr;
  return pbDataPtr + 0x10;
}

Assistant:

LPBYTE CaptureContentKey(LPBYTE pbDataPtr, LPBYTE pbDataEnd, PCONTENT_KEY * PtrCKey)
{
    // Is there enough data?
    if((pbDataPtr + sizeof(CONTENT_KEY)) > pbDataEnd)
        return NULL;

    // Give data
    PtrCKey[0] = (PCONTENT_KEY)pbDataPtr;

    // Return the pointer to data following after the integer
    return pbDataPtr + sizeof(CONTENT_KEY);
}